

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

void ures_initStackObject_63(UResourceBundle *resB)

{
  memset(resB,0,200);
  return;
}

Assistant:

static void ures_setIsStackObject( UResourceBundle* resB, UBool state) {
    if(state) {
        resB->fMagic1 = 0;
        resB->fMagic2 = 0;
    } else {
        resB->fMagic1 = MAGIC1;
        resB->fMagic2 = MAGIC2;
    }
}